

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

ushort __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  undefined4 *puVar5;
  char *pcVar6;
  
  pcVar6 = (this->super_HeapBlock).address;
  if (interiorAddress < pcVar6 || pcVar6 + 0x8000 <= interiorAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x246,
                       "(interiorAddress >= address && interiorAddress < this->GetEndAddress())",
                       "interiorAddress >= address && interiorAddress < this->GetEndAddress()");
    if (!bVar2) goto LAB_006ab97f;
    *puVar5 = 0;
    pcVar6 = (this->super_HeapBlock).address;
  }
  iVar4 = (int)pcVar6;
  if (((ulong)pcVar6 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x247,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar2) goto LAB_006ab97f;
    *puVar5 = 0;
    iVar4 = (int)(this->super_HeapBlock).address;
  }
  uVar3 = ValidPointers<MediumAllocationBlockAttributes>::GetInteriorAddressIndex
                    (&this->validPointers,(uint)((int)interiorAddress - iVar4) >> 4);
  if (0x800 < (ushort)(uVar3 + 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x24e,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar2) {
LAB_006ab97f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return uVar3;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetInteriorAddressIndex(void * interiorAddress)
{
    Assert(interiorAddress >= address && interiorAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)interiorAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetInteriorAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}